

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O1

JL_STATUS FreeUnmarshalledDictionary
                    (JlMarshallElement *StructDescription,size_t StructDescriptionCount,
                    void *Structure)

{
  JlMarshallElement *Description;
  ulong uVar1;
  ulong in_RAX;
  ulong uVar2;
  size_t ListCount;
  void *CountFieldPtr;
  char **stringPtr;
  undefined8 *Structure_00;
  
  if (StructDescriptionCount != 0) {
    uVar2 = 0;
    uVar1 = 1;
    do {
      in_RAX = uVar1;
      Description = StructDescription + uVar2;
      Structure_00 = (undefined8 *)(StructDescription[uVar2].FieldOffset + (long)Structure);
      if (StructDescription[uVar2].IsArray == true) {
        CountFieldPtr = (void *)(Description->CountFieldOffset + (long)Structure);
        ListCount = JlMemoryReadCountValue(CountFieldPtr,Description->CountFieldSize);
        FreeUnmarshalledList(Description,Structure_00,ListCount);
        JlMemoryWriteCountValue(CountFieldPtr,Description->CountFieldSize,0);
      }
      else if (Description->Type == JL_DATA_TYPE_STRING) {
        if ((Description->FieldSize == 0) && ((void *)*Structure_00 != (void *)0x0)) {
          WjTestLib_Free((void *)*Structure_00);
          *Structure_00 = 0;
        }
      }
      else if (Description->Type == JL_DATA_TYPE_DICTIONARY) {
        FreeUnmarshalledDictionary
                  (Description->ChildStructDescription,
                   (ulong)Description->ChildStructDescriptionCount,Structure_00);
      }
      uVar2 = in_RAX;
      uVar1 = (ulong)((int)in_RAX + 1);
    } while (in_RAX < StructDescriptionCount);
  }
  return (JL_STATUS)in_RAX;
}

Assistant:

static
JL_STATUS
    FreeUnmarshalledDictionary
    (
        JlMarshallElement const*    StructDescription,
        size_t                      StructDescriptionCount,
        void*                       Structure
    )
{
    JL_STATUS jlStatus = JL_STATUS_SUCCESS;

    for( uint32_t i=0; i<StructDescriptionCount && JL_STATUS_SUCCESS==jlStatus; i++ )
    {
        JlMarshallElement const* itemDescription = &StructDescription[i];
        JL_DATA_TYPE type = itemDescription->Type;
        void* itemPtr = ((uint8_t*)Structure)+itemDescription->FieldOffset;

        if( itemDescription->IsArray )
        {
            void* countFieldPtr = ((uint8_t*)Structure) + itemDescription->CountFieldOffset;
            size_t arrayCount = JlMemoryReadCountValue( countFieldPtr, itemDescription->CountFieldSize );
            jlStatus = FreeUnmarshalledList( itemDescription, itemPtr, arrayCount );
            (void) JlMemoryWriteCountValue( countFieldPtr, itemDescription->CountFieldSize, 0 );
        }
        else if( JL_DATA_TYPE_DICTIONARY == type )
        {
            jlStatus = FreeUnmarshalledDictionary( itemDescription->ChildStructDescription, itemDescription->ChildStructDescriptionCount, itemPtr );
        }
        else if( JL_DATA_TYPE_STRING == type )
        {
            if( 0 == itemDescription->FieldSize )
            {
                // 0 means that itemPtr is pointing to a char* that was allocated
                char** stringPtr = itemPtr;
                if( NULL != *stringPtr )
                {
                    JlFree( *stringPtr );
                    *stringPtr = NULL;
                }
                jlStatus = JL_STATUS_SUCCESS;
            }
            else
            {
                // Fixed sized string in struct, so we don't deallocate it
                jlStatus = JL_STATUS_SUCCESS;
            }
        }
        else
        {
            // Is a Number, Bool. These are not allocated
            jlStatus = JL_STATUS_SUCCESS;
        }
    }

    return jlStatus;
}